

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::StrictMock<MockUnaryVisitor>::StrictMock(StrictMock<MockUnaryVisitor> *this)

{
  MockUnaryVisitor::MockUnaryVisitor(&this->super_MockUnaryVisitor);
  (this->super_MockUnaryVisitor).super_ExprVisitor<MockUnaryVisitor,_TestResult>.
  super_BasicExprVisitor<MockUnaryVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_001ccc10;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }